

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writer.h
# Opt level: O0

void __thiscall
rapidjson::
Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
::Prefix(Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
         *this,Type type)

{
  size_t sVar1;
  Level *pLVar2;
  Ch local_29;
  Level *level;
  Type type_local;
  Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
  *this_local;
  
  sVar1 = internal::Stack<rapidjson::CrtAllocator>::GetSize(&this->level_stack_);
  if (sVar1 == 0) {
    if (((this->hasRoot_ ^ 0xffU) & 1) == 0) {
      __assert_fail("!hasRoot_",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/rapidjson/writer.h"
                    ,0x1d2,
                    "void rapidjson::Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<>>>::Prefix(Type) [OutputStream = rapidjson::GenericStringBuffer<rapidjson::UTF8<>>, SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, writeFlags = 0]"
                   );
    }
    this->hasRoot_ = true;
  }
  else {
    pLVar2 = internal::Stack<rapidjson::CrtAllocator>::
             Top<rapidjson::Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,rapidjson::CrtAllocator>,rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator,0u>::Level>
                       (&this->level_stack_);
    if (pLVar2->valueCount != 0) {
      if ((pLVar2->inArray & 1U) == 0) {
        local_29 = ',';
        if ((pLVar2->valueCount & 1) != 0) {
          local_29 = ':';
        }
        GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::Put(this->os_,local_29)
        ;
      }
      else {
        GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::Put(this->os_,',');
      }
    }
    if ((((pLVar2->inArray & 1U) == 0) && ((pLVar2->valueCount & 1) == 0)) && (type != kStringType))
    {
      __assert_fail("type == kStringType",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/rapidjson/writer.h"
                    ,0x1ce,
                    "void rapidjson::Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<>>>::Prefix(Type) [OutputStream = rapidjson::GenericStringBuffer<rapidjson::UTF8<>>, SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, writeFlags = 0]"
                   );
    }
    pLVar2->valueCount = pLVar2->valueCount + 1;
  }
  return;
}

Assistant:

void Prefix(Type type) {
        (void)type;
        if (RAPIDJSON_LIKELY(level_stack_.GetSize() != 0)) { // this value is not at root
            Level* level = level_stack_.template Top<Level>();
            if (level->valueCount > 0) {
                if (level->inArray) 
                    os_->Put(','); // add comma if it is not the first element in array
                else  // in object
                    os_->Put((level->valueCount % 2 == 0) ? ',' : ':');
            }
            if (!level->inArray && level->valueCount % 2 == 0)
                RAPIDJSON_ASSERT(type == kStringType);  // if it's in object, then even number should be a name
            level->valueCount++;
        }
        else {
            RAPIDJSON_ASSERT(!hasRoot_);    // Should only has one and only one root.
            hasRoot_ = true;
        }
    }